

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_node.c
# Opt level: O0

void JPCommonNode_clear(JPCommonNode *node)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  if (in_RDI[1] != 0) {
    free((void *)in_RDI[1]);
    in_RDI[1] = 0;
  }
  if (in_RDI[2] != 0) {
    free((void *)in_RDI[2]);
    in_RDI[2] = 0;
  }
  if (in_RDI[3] != 0) {
    free((void *)in_RDI[3]);
    in_RDI[3] = 0;
  }
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0xffffffff;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  return;
}

Assistant:

void JPCommonNode_clear(JPCommonNode * node)
{
   if (node->pron != NULL) {
      free(node->pron);
      node->pron = NULL;
   }
   if (node->pos != NULL) {
      free(node->pos);
      node->pos = NULL;
   }
   if (node->ctype != NULL) {
      free(node->ctype);
      node->ctype = NULL;
   }
   if (node->cform != NULL) {
      free(node->cform);
      node->cform = NULL;
   }
   node->acc = 0;
   node->chain_flag = -1;
   node->prev = NULL;
   node->next = NULL;
}